

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O3

void initGlobalPermute(void)

{
  undefined1 auVar1 [16];
  int iVar2;
  int *piVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  iVar2 = numOfVariables;
  lVar5 = (long)numOfVariables;
  if (booleanOptions[2] == 0) {
    globalPermute = (int *)malloc(lVar5 * 4 + 4);
    auVar1 = _DAT_00104020;
    if (-1 < iVar2) {
      uVar6 = lVar5 + 1;
      lVar5 = (uVar6 & 0xffffffff) - 1;
      uVar4 = 0;
      auVar7._8_4_ = (int)lVar5;
      auVar7._0_8_ = lVar5;
      auVar7._12_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar7 = auVar7 ^ _DAT_00104020;
      auVar8 = _DAT_00104010;
      do {
        auVar9 = auVar8 ^ auVar1;
        if ((bool)(~(auVar7._4_4_ < auVar9._4_4_ ||
                    auVar9._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar9._0_4_) & 1)) {
          globalPermute[uVar4] = (int)uVar4;
        }
        if ((auVar9._12_4_ != auVar7._12_4_ || auVar9._8_4_ <= auVar7._8_4_) &&
            auVar9._12_4_ <= auVar7._12_4_) {
          globalPermute[uVar4 + 1] = (int)uVar4 + 1;
        }
        uVar4 = uVar4 + 2;
        lVar5 = auVar8._8_8_;
        auVar8._0_8_ = auVar8._0_8_ + 2;
        auVar8._8_8_ = lVar5 + 2;
      } while (((int)uVar6 + 1U & 0xfffffffe) != uVar4);
    }
  }
  else {
    piVar3 = getRandomFromOne(numOfVariables);
    uVar4 = (ulong)(uint)numOfVariables;
    globalPermute = piVar3;
    if (0 < numOfVariables) {
      lVar5 = 1;
      do {
        next = next * 0x41c64e6d + 0x3039;
        if (((uint)next >> 0x10 & 1) != 0) {
          piVar3[lVar5] = -piVar3[lVar5];
        }
        lVar5 = lVar5 + 1;
      } while (uVar4 + 1 != lVar5);
    }
  }
  return;
}

Assistant:

void initGlobalPermute()
{
    int v;

    if (booleanOptions[REORDER])
    {
        globalPermute = getRandomFromOne (numOfVariables);
        for (v=1;v<=numOfVariables;v++)
            if (myrand() % 2 ==1 )
                globalPermute[v] = -globalPermute[v];
    }
    else
        globalPermute = getIdentityFromZero (numOfVariables+1);

}